

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * fts3ReallocOrFree(void *pOrig,sqlite3_int64 nNew)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = sqlite3_initialize();
  if ((iVar1 == 0) && (pvVar2 = sqlite3Realloc(pOrig,nNew), pvVar2 != (void *)0x0)) {
    return pvVar2;
  }
  sqlite3_free(pOrig);
  return (void *)0x0;
}

Assistant:

static void *fts3ReallocOrFree(void *pOrig, sqlite3_int64 nNew){
  void *pRet = sqlite3_realloc64(pOrig, nNew);
  if( !pRet ){
    sqlite3_free(pOrig);
  }
  return pRet;
}